

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ConfigureStreamingOutput(UnitTestImpl *this)

{
  ulong uVar1;
  TestEventListeners *this_00;
  StreamingListener *this_01;
  undefined8 uVar2;
  string local_90 [32];
  string local_70 [48];
  long local_40;
  size_t pos;
  size_t *local_18;
  string *target;
  UnitTestImpl *this_local;
  
  target = (string *)this;
  String::operator_cast_to_string((String *)&pos);
  local_18 = &pos;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_40 = std::__cxx11::string::find((char)local_18,0x3a);
    if (local_40 == -1) {
      uVar2 = std::__cxx11::string::c_str();
      printf("WARNING: unrecognized streaming target \"%s\" ignored.\n",uVar2);
      fflush(_stdout);
    }
    else {
      this_00 = listeners(this);
      this_01 = (StreamingListener *)operator_new(0x50);
      std::__cxx11::string::substr((ulong)local_70,(ulong)local_18);
      std::__cxx11::string::substr((ulong)local_90,(ulong)local_18);
      StreamingListener::StreamingListener(this_01,local_70,local_90);
      TestEventListeners::Append(this_00,(TestEventListener *)this_01);
      std::__cxx11::string::~string((string *)local_90);
      std::__cxx11::string::~string((string *)local_70);
    }
  }
  std::__cxx11::string::~string((string *)&pos);
  return;
}

Assistant:

void UnitTestImpl::ConfigureStreamingOutput() {
  const string& target = GTEST_FLAG(stream_result_to);
  if (!target.empty()) {
    const size_t pos = target.find(':');
    if (pos != string::npos) {
      listeners()->Append(new StreamingListener(target.substr(0, pos),
                                                target.substr(pos+1)));
    } else {
      printf("WARNING: unrecognized streaming target \"%s\" ignored.\n",
             target.c_str());
      fflush(stdout);
    }
  }
}